

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::NeuralNetwork::SerializeWithCachedSizes
          (NeuralNetwork *this,CodedOutputStream *output)

{
  int iVar1;
  Type *value;
  Type *value_00;
  int iVar2;
  
  iVar1 = (this->layers_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar2 = 0;
    do {
      value = google::protobuf::internal::RepeatedPtrFieldBase::
              Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                        (&(this->layers_).super_RepeatedPtrFieldBase,iVar2);
      google::protobuf::internal::WireFormatLite::WriteMessage(1,&value->super_MessageLite,output);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  iVar1 = (this->preprocessing_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    iVar2 = 0;
    do {
      value_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                 Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                           (&(this->preprocessing_).super_RepeatedPtrFieldBase,iVar2);
      google::protobuf::internal::WireFormatLite::WriteMessage
                (2,&value_00->super_MessageLite,output);
      iVar2 = iVar2 + 1;
    } while (iVar1 != iVar2);
  }
  if (this->arrayinputshapemapping_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(5,this->arrayinputshapemapping_,output);
  }
  if (this->imageinputshapemapping_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteEnum(6,this->imageinputshapemapping_,output);
  }
  if (this->updateparams_ != (NetworkUpdateParameters *)0x0 &&
      this != (NeuralNetwork *)&_NeuralNetwork_default_instance_) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (10,&this->updateparams_->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void NeuralNetwork::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.NeuralNetwork)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .CoreML.Specification.NeuralNetworkLayer layers = 1;
  for (unsigned int i = 0, n = this->layers_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      1, this->layers(i), output);
  }

  // repeated .CoreML.Specification.NeuralNetworkPreprocessing preprocessing = 2;
  for (unsigned int i = 0, n = this->preprocessing_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      2, this->preprocessing(i), output);
  }

  // .CoreML.Specification.NeuralNetworkMultiArrayShapeMapping arrayInputShapeMapping = 5;
  if (this->arrayinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      5, this->arrayinputshapemapping(), output);
  }

  // .CoreML.Specification.NeuralNetworkImageShapeMapping imageInputShapeMapping = 6;
  if (this->imageinputshapemapping() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteEnum(
      6, this->imageinputshapemapping(), output);
  }

  // .CoreML.Specification.NetworkUpdateParameters updateParams = 10;
  if (this->has_updateparams()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      10, *this->updateparams_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.NeuralNetwork)
}